

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CConsole::AddCommandSorted(CConsole *this,CCommand *pCommand)

{
  int iVar1;
  long in_RSI;
  char *in_RDI;
  CCommand *p;
  char *in_stack_ffffffffffffffd8;
  long local_18;
  
  if ((*(long *)(in_RDI + 0x28) == 0) ||
     (iVar1 = str_comp(in_RDI,in_stack_ffffffffffffffd8), iVar1 < 1)) {
    if ((*(long *)(in_RDI + 0x28) == 0) || (*(long *)(*(long *)(in_RDI + 0x28) + 0x28) == 0)) {
      *(undefined8 *)(in_RSI + 0x28) = 0;
    }
    else {
      *(undefined8 *)(in_RSI + 0x28) = *(undefined8 *)(in_RDI + 0x28);
    }
    *(long *)(in_RDI + 0x28) = in_RSI;
  }
  else {
    for (local_18 = *(long *)(in_RDI + 0x28); local_18 != 0; local_18 = *(long *)(local_18 + 0x28))
    {
      if ((*(long *)(local_18 + 0x28) == 0) ||
         (iVar1 = str_comp(in_RDI,in_stack_ffffffffffffffd8), iVar1 < 1)) {
        *(undefined8 *)(in_RSI + 0x28) = *(undefined8 *)(local_18 + 0x28);
        *(long *)(local_18 + 0x28) = in_RSI;
        return;
      }
    }
  }
  return;
}

Assistant:

void CConsole::AddCommandSorted(CCommand *pCommand)
{
	if(!m_pFirstCommand || str_comp(pCommand->m_pName, m_pFirstCommand->m_pName) <= 0)
	{
		if(m_pFirstCommand && m_pFirstCommand->m_pNext)
			pCommand->m_pNext = m_pFirstCommand;
		else
			pCommand->m_pNext = 0;
		m_pFirstCommand = pCommand;
	}
	else
	{
		for(CCommand *p = m_pFirstCommand; p; p = p->m_pNext)
		{
			if(!p->m_pNext || str_comp(pCommand->m_pName, p->m_pNext->m_pName) <= 0)
			{
				pCommand->m_pNext = p->m_pNext;
				p->m_pNext = pCommand;
				break;
			}
		}
	}
}